

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O3

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  OBJ_DATA *obj;
  
  pEVar1 = room->exit[dir];
  obj = (OBJ_DATA *)&ch->carrying;
  do {
    obj = obj->next;
    if (obj == (OBJ_DATA *)0x0) {
      if ((pEVar1->exit_info[0] & 2U) != 0) goto LAB_002fe68d;
      pEVar1->exit_info[0] = pEVar1->exit_info[0] | 6;
      goto LAB_002fe66d;
    }
  } while (obj->pIndexData->vnum != 0x6014);
  if ((pEVar1->exit_info[0] & 2U) == 0) {
    pEVar1->exit_info[0] = pEVar1->exit_info[0] | 6;
    act("As you pass through the door, $p crumbles to dust.",ch,obj,(void *)0x0,3);
    obj_from_char(obj);
    extract_obj(obj);
LAB_002fe66d:
    bVar2 = true;
    if (room->people != (CHAR_DATA *)0x0) {
      act("The eastern door slams shut.",room->people,(void *)0x0,(void *)0x0,0);
    }
  }
  else {
LAB_002fe68d:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	EXIT_DATA *exit = room->exit[dir];
	OBJ_DATA *obj;
	bool found= false;

	for (obj = ch->carrying; obj != nullptr; obj = obj->next)
	{
		if (obj->pIndexData->vnum == 24596)
		{
			found = true;
			break;
		}
	}

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return false;

	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);

	if (found)
	{
		act("As you pass through the door, $p crumbles to dust.", ch, obj, 0, TO_CHAR);
		obj_from_char(obj);
		extract_obj(obj);
	}

	if (room->people)
		act("The eastern door slams shut.", room->people, 0, 0, TO_ROOM);

	return true;
}